

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O0

bool __thiscall ConditionMarker::verifyCondition(ConditionMarker *this,PcodeOp *op,PcodeOp *initop)

{
  bool bVar1;
  OpCode OVar2;
  Varnode *vn;
  int local_34;
  int4 i;
  Varnode *matchvn;
  PcodeOp *initop_local;
  PcodeOp *op_local;
  ConditionMarker *this_local;
  
  setupInitOp(this,initop);
  vn = findMatch(this,op);
  if (vn == (Varnode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = finalJudgement(this,vn);
    if (bVar1) {
      if ((this->multion & 1U) == 0) {
        this->multislot = -1;
      }
      else {
        for (local_34 = 0; local_34 < this->state; local_34 = local_34 + 1) {
          OVar2 = PcodeOp::code(this->opstate[local_34]);
          if (OVar2 == CPUI_MULTIEQUAL) {
            this->multislot = this->slotstate[local_34];
            break;
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ConditionMarker::verifyCondition(PcodeOp *op,PcodeOp *initop)

{
  setupInitOp(initop);
  Varnode *matchvn = findMatch(op);
  if (matchvn == (Varnode *)0) return false;
  if (!finalJudgement(matchvn)) return false;

  // Make final determination of what MULTIEQUAL slot is used
  if (!multion)
    multislot = -1;
  else {
    for(int4 i=0;i<state;++i)
      if (opstate[i]->code()==CPUI_MULTIEQUAL) {
	multislot = slotstate[i];
	break;
      }
  }
  return true;
}